

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall
SQCompiler::INVOKE_EXP<void(SQCompiler::*)()>(SQCompiler *this,offset_in_SQCompiler_to_subr f)

{
  SQInteger SVar1;
  SQInteger SVar2;
  bool bVar3;
  undefined7 uVar4;
  long in_RDX;
  long *plVar5;
  SQExpState es;
  
  bVar3 = (this->_es).donot_get;
  uVar4 = *(undefined7 *)&(this->_es).field_0x11;
  SVar1 = (this->_es).etype;
  SVar2 = (this->_es).epos;
  (this->_es).etype = 1;
  (this->_es).epos = -1;
  (this->_es).donot_get = false;
  plVar5 = (long *)((long)&this->_token + in_RDX);
  if ((f & 1) != 0) {
    f = *(undefined8 *)(*plVar5 + -1 + f);
  }
  (*(code *)f)(plVar5);
  (this->_es).donot_get = bVar3;
  *(undefined7 *)&(this->_es).field_0x11 = uVar4;
  (this->_es).etype = SVar1;
  (this->_es).epos = SVar2;
  return;
}

Assistant:

void INVOKE_EXP(T f)
    {
        SQExpState es = _es;
        _es.etype     = EXPR;
        _es.epos      = -1;
        _es.donot_get = false;
        (this->*f)();
        _es = es;
    }